

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_dc_left_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  __m128i dc;
  
  dc_sum_32(left);
  dc[0]._0_4_ = extraout_XMM0_Da + 0x10U >> 5;
  dc[0]._4_4_ = extraout_XMM0_Db >> 5;
  dc[1]._0_4_ = extraout_XMM0_Dc >> 5;
  dc[1]._4_4_ = extraout_XMM0_Dd >> 5;
  dc_store_16xh(dst,stride,0x20,&dc);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_16x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  const __m128i sixteen = _mm_cvtsi32_si128(16);
  const __m128i sum = dc_sum_32(left);
  const __m128i dc = _mm_srli_epi32(_mm_add_epi32(sum, sixteen), 5);
  (void)above;
  (void)bd;
  dc_store_16xh(dst, stride, 32, &dc);
}